

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall cmMakefile::GetDefinition(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  char *pcVar2;
  char *newValue;
  StackIter local_28;
  StackIter local_20;
  
  local_20.current._M_node = (_List_iterator<cmDefinitions>)(this->Internal).x_;
  local_28.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)
        &((_List_node_base *)local_20.current._M_node)->_M_next)->
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>)._M_impl._M_node.
       super__List_node_base._M_next;
  pcVar2 = cmDefinitions::Get(name,&local_20,&local_28);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = cmState::GetInitializedCacheValue
                       (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
  }
  pcVar1 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
  if (((pcVar1 != (cmake *)0x0) &&
      (this_00 = pcVar1->VariableWatch, this_00 != (cmVariableWatch *)0x0)) &&
     (this->SuppressWatches == false)) {
    newValue = pcVar2;
    if (pcVar2 == (char *)0x0) {
      newValue = (char *)0x0;
    }
    cmVariableWatch::VariableAccessed(this_00,name,(uint)(pcVar2 == (char *)0x0),newValue,this);
  }
  return pcVar2;
}

Assistant:

const char* cmMakefile::GetDefinition(const std::string& name) const
{
  const char* def = this->Internal->GetDefinition(name);
  if(!def)
    {
    def = this->GetState()->GetInitializedCacheValue(name);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv && !this->SuppressWatches )
    {
    if ( def )
      {
      vv->VariableAccessed(name, cmVariableWatch::VARIABLE_READ_ACCESS,
        def, this);
      }
    else
      {
      vv->VariableAccessed(name,
          cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS, def, this);
      }
    }
#endif
  return def;
}